

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack8.h
# Opt level: O1

void ncnn::convdw5x5s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  float *pfVar48;
  float *pfVar49;
  float *pfVar50;
  float *pfVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  void *pvVar55;
  void *pvVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  void *pvVar369;
  void *pvVar370;
  void *pvVar371;
  void *pvVar372;
  long lVar373;
  int iVar374;
  int iVar375;
  void *pvVar376;
  long lVar377;
  void *pvVar378;
  long lVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  
  iVar52 = bottom_blob->c;
  if (0 < (long)iVar52) {
    iVar53 = top_blob->w;
    iVar54 = top_blob->h;
    pvVar55 = _bias->data;
    lVar373 = 0;
    do {
      if (pvVar55 == (void *)0x0) {
        fVar382 = 0.0;
        fVar383 = 0.0;
        fVar380 = 0.0;
        fVar381 = 0.0;
        fVar384 = 0.0;
        fVar385 = 0.0;
        fVar386 = 0.0;
        fVar387 = 0.0;
      }
      else {
        pfVar1 = (float *)((long)pvVar55 + lVar373 * 0x20);
        fVar380 = *pfVar1;
        fVar381 = pfVar1[1];
        fVar382 = pfVar1[2];
        fVar383 = pfVar1[3];
        fVar384 = pfVar1[4];
        fVar385 = pfVar1[5];
        fVar386 = pfVar1[6];
        fVar387 = pfVar1[7];
      }
      if (0 < iVar54) {
        pvVar371 = (void *)(top_blob->cstep * lVar373 * top_blob->elemsize + (long)top_blob->data);
        lVar379 = kernel->w * lVar373 * kernel->elemsize;
        pvVar56 = kernel->data;
        pvVar376 = (void *)(bottom_blob->cstep * lVar373 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        lVar377 = (long)bottom_blob->w * bottom_blob->elemsize;
        pvVar372 = (void *)((long)pvVar376 + lVar377 * 4);
        pvVar369 = (void *)(lVar377 * 3 + (long)pvVar376);
        pvVar370 = (void *)((long)pvVar376 + lVar377 * 2);
        pvVar378 = (void *)(lVar377 + (long)pvVar376);
        iVar375 = 0;
        do {
          if (0 < iVar53) {
            lVar377 = 0;
            iVar374 = iVar53;
            do {
              pfVar1 = (float *)((long)pvVar56 + lVar379);
              fVar57 = pfVar1[1];
              fVar58 = pfVar1[2];
              fVar59 = pfVar1[3];
              fVar60 = pfVar1[4];
              fVar61 = pfVar1[5];
              fVar62 = pfVar1[6];
              fVar63 = pfVar1[7];
              pfVar6 = (float *)((long)pvVar56 + lVar379 + 0x20);
              fVar64 = pfVar6[1];
              fVar65 = pfVar6[2];
              fVar66 = pfVar6[3];
              fVar67 = pfVar6[4];
              fVar68 = pfVar6[5];
              fVar69 = pfVar6[6];
              pfVar7 = (float *)((long)pvVar56 + lVar379 + 0x40);
              fVar70 = pfVar7[1];
              fVar71 = pfVar7[2];
              fVar72 = pfVar7[3];
              fVar73 = pfVar7[4];
              fVar74 = pfVar7[5];
              fVar75 = pfVar7[6];
              fVar76 = pfVar7[7];
              pfVar8 = (float *)((long)pvVar56 + lVar379 + 0x60);
              fVar77 = pfVar8[1];
              fVar78 = pfVar8[2];
              fVar79 = pfVar8[3];
              fVar80 = pfVar8[4];
              fVar81 = pfVar8[5];
              fVar82 = pfVar8[6];
              pfVar26 = (float *)((long)pvVar56 + lVar379 + 0x80);
              fVar83 = pfVar26[1];
              fVar84 = pfVar26[2];
              fVar85 = pfVar26[3];
              fVar86 = pfVar26[4];
              fVar87 = pfVar26[5];
              fVar88 = pfVar26[6];
              pfVar2 = (float *)((long)pvVar376 + lVar377);
              fVar89 = pfVar2[1];
              fVar90 = pfVar2[2];
              fVar91 = pfVar2[3];
              fVar92 = pfVar2[4];
              fVar93 = pfVar2[5];
              fVar94 = pfVar2[6];
              pfVar9 = (float *)((long)pvVar376 + lVar377 + 0x20);
              fVar95 = pfVar9[1];
              fVar96 = pfVar9[2];
              fVar97 = pfVar9[3];
              fVar98 = pfVar9[4];
              fVar99 = pfVar9[5];
              fVar100 = pfVar9[6];
              pfVar10 = (float *)((long)pvVar376 + lVar377 + 0x40);
              fVar101 = pfVar10[1];
              fVar102 = pfVar10[2];
              fVar103 = pfVar10[3];
              fVar104 = pfVar10[4];
              fVar105 = pfVar10[5];
              fVar106 = pfVar10[6];
              fVar388 = pfVar6[7] + fVar76;
              pfVar11 = (float *)((long)pvVar376 + lVar377 + 0x60);
              fVar107 = pfVar11[1];
              fVar108 = pfVar11[2];
              fVar109 = pfVar11[3];
              fVar110 = pfVar11[4];
              fVar111 = pfVar11[5];
              fVar112 = pfVar11[6];
              pfVar27 = (float *)((long)pvVar376 + lVar377 + 0x80);
              fVar113 = pfVar27[1];
              fVar114 = pfVar27[2];
              fVar115 = pfVar27[3];
              fVar116 = pfVar27[4];
              fVar117 = pfVar27[5];
              fVar118 = pfVar27[6];
              pfVar28 = (float *)((long)pvVar56 + lVar379 + 0xa0);
              fVar119 = pfVar28[1];
              fVar120 = pfVar28[2];
              fVar121 = pfVar28[3];
              fVar122 = pfVar28[4];
              fVar123 = pfVar28[5];
              fVar124 = pfVar28[6];
              fVar125 = pfVar28[7];
              pfVar29 = (float *)((long)pvVar56 + lVar379 + 0xc0);
              fVar126 = pfVar29[1];
              fVar127 = pfVar29[2];
              fVar128 = pfVar29[3];
              fVar129 = pfVar29[4];
              fVar130 = pfVar29[5];
              fVar131 = pfVar29[6];
              fVar132 = pfVar29[7];
              pfVar30 = (float *)((long)pvVar56 + lVar379 + 0xe0);
              fVar133 = pfVar30[1];
              fVar134 = pfVar30[2];
              fVar135 = pfVar30[3];
              fVar136 = pfVar30[4];
              fVar137 = pfVar30[5];
              fVar138 = pfVar30[6];
              pfVar31 = (float *)((long)pvVar56 + lVar379 + 0x100);
              fVar139 = pfVar31[1];
              fVar140 = pfVar31[2];
              fVar141 = pfVar31[3];
              fVar142 = pfVar31[4];
              fVar143 = pfVar31[5];
              fVar144 = pfVar31[6];
              pfVar32 = (float *)((long)pvVar56 + lVar379 + 0x120);
              fVar145 = pfVar32[1];
              fVar146 = pfVar32[2];
              fVar147 = pfVar32[3];
              fVar148 = pfVar32[4];
              fVar149 = pfVar32[5];
              fVar150 = pfVar32[6];
              pfVar24 = (float *)((long)pvVar378 + lVar377);
              fVar151 = pfVar24[1];
              fVar152 = pfVar24[2];
              fVar153 = pfVar24[3];
              fVar154 = pfVar24[4];
              fVar155 = pfVar24[5];
              fVar156 = pfVar24[6];
              pfVar12 = (float *)((long)pvVar378 + lVar377 + 0x20);
              fVar157 = pfVar12[1];
              fVar158 = pfVar12[2];
              fVar159 = pfVar12[3];
              fVar160 = pfVar12[4];
              fVar161 = pfVar12[5];
              fVar162 = pfVar12[6];
              pfVar13 = (float *)((long)pvVar378 + lVar377 + 0x40);
              fVar163 = pfVar13[1];
              fVar164 = pfVar13[2];
              fVar165 = pfVar13[3];
              fVar166 = pfVar13[4];
              fVar167 = pfVar13[5];
              fVar168 = pfVar13[6];
              pfVar14 = (float *)((long)pvVar378 + lVar377 + 0x60);
              fVar169 = pfVar14[1];
              fVar170 = pfVar14[2];
              fVar171 = pfVar14[3];
              fVar172 = pfVar14[4];
              fVar173 = pfVar14[5];
              fVar174 = pfVar14[6];
              pfVar33 = (float *)((long)pvVar378 + lVar377 + 0x80);
              fVar175 = pfVar33[1];
              fVar176 = pfVar33[2];
              fVar177 = pfVar33[3];
              fVar178 = pfVar33[4];
              fVar179 = pfVar33[5];
              fVar180 = pfVar33[6];
              pfVar34 = (float *)((long)pvVar56 + lVar379 + 0x140);
              fVar181 = pfVar34[1];
              fVar182 = pfVar34[2];
              fVar183 = pfVar34[3];
              fVar184 = pfVar34[4];
              fVar185 = pfVar34[5];
              fVar186 = pfVar34[6];
              fVar187 = pfVar34[7];
              pfVar35 = (float *)((long)pvVar56 + lVar379 + 0x160);
              fVar188 = pfVar35[1];
              fVar189 = pfVar35[2];
              fVar190 = pfVar35[3];
              fVar191 = pfVar35[4];
              fVar192 = pfVar35[5];
              fVar193 = pfVar35[6];
              fVar194 = pfVar35[7];
              pfVar36 = (float *)((long)pvVar56 + lVar379 + 0x180);
              fVar195 = pfVar36[1];
              fVar196 = pfVar36[2];
              fVar197 = pfVar36[3];
              fVar198 = pfVar36[4];
              fVar199 = pfVar36[5];
              fVar200 = pfVar36[6];
              fVar201 = pfVar36[7];
              pfVar37 = (float *)((long)pvVar56 + lVar379 + 0x1a0);
              fVar202 = pfVar37[1];
              fVar203 = pfVar37[2];
              fVar204 = pfVar37[3];
              fVar205 = pfVar37[4];
              fVar206 = pfVar37[5];
              fVar207 = pfVar37[6];
              pfVar38 = (float *)((long)pvVar56 + lVar379 + 0x1c0);
              fVar208 = pfVar38[1];
              fVar209 = pfVar38[2];
              fVar210 = pfVar38[3];
              fVar211 = pfVar38[4];
              fVar212 = pfVar38[5];
              fVar213 = pfVar38[6];
              pfVar3 = (float *)((long)pvVar370 + lVar377);
              fVar214 = pfVar3[1];
              fVar215 = pfVar3[2];
              fVar216 = pfVar3[3];
              fVar217 = pfVar3[4];
              fVar218 = pfVar3[5];
              fVar219 = pfVar3[6];
              pfVar15 = (float *)((long)pvVar370 + lVar377 + 0x20);
              fVar220 = pfVar15[1];
              fVar221 = pfVar15[2];
              fVar222 = pfVar15[3];
              fVar223 = pfVar15[4];
              fVar224 = pfVar15[5];
              fVar225 = pfVar15[6];
              pfVar16 = (float *)((long)pvVar370 + lVar377 + 0x40);
              fVar226 = pfVar16[1];
              fVar227 = pfVar16[2];
              fVar228 = pfVar16[3];
              fVar229 = pfVar16[4];
              fVar230 = pfVar16[5];
              fVar231 = pfVar16[6];
              pfVar17 = (float *)((long)pvVar370 + lVar377 + 0x60);
              fVar232 = pfVar17[1];
              fVar233 = pfVar17[2];
              fVar234 = pfVar17[3];
              fVar235 = pfVar17[4];
              fVar236 = pfVar17[5];
              fVar237 = pfVar17[6];
              pfVar39 = (float *)((long)pvVar370 + lVar377 + 0x80);
              fVar238 = pfVar39[1];
              fVar239 = pfVar39[2];
              fVar240 = pfVar39[3];
              fVar241 = pfVar39[4];
              fVar242 = pfVar39[5];
              fVar243 = pfVar39[6];
              pfVar40 = (float *)((long)pvVar56 + lVar379 + 0x1e0);
              fVar244 = pfVar40[1];
              fVar245 = pfVar40[2];
              fVar246 = pfVar40[3];
              fVar247 = pfVar40[4];
              fVar248 = pfVar40[5];
              fVar249 = pfVar40[6];
              fVar250 = pfVar40[7];
              pfVar41 = (float *)((long)pvVar56 + lVar379 + 0x200);
              fVar251 = pfVar41[1];
              fVar252 = pfVar41[2];
              fVar253 = pfVar41[3];
              fVar254 = pfVar41[4];
              fVar255 = pfVar41[5];
              fVar256 = pfVar41[6];
              fVar257 = pfVar41[7];
              pfVar42 = (float *)((long)pvVar56 + lVar379 + 0x220);
              fVar258 = pfVar42[1];
              fVar259 = pfVar42[2];
              fVar260 = pfVar42[3];
              fVar261 = pfVar42[4];
              fVar262 = pfVar42[5];
              fVar263 = pfVar42[6];
              fVar264 = pfVar42[7];
              pfVar43 = (float *)((long)pvVar56 + lVar379 + 0x240);
              fVar265 = pfVar43[1];
              fVar266 = pfVar43[2];
              fVar267 = pfVar43[3];
              fVar268 = pfVar43[4];
              fVar269 = pfVar43[5];
              fVar270 = pfVar43[6];
              pfVar44 = (float *)((long)pvVar56 + lVar379 + 0x260);
              fVar271 = pfVar44[1];
              fVar272 = pfVar44[2];
              fVar273 = pfVar44[3];
              fVar274 = pfVar44[4];
              fVar275 = pfVar44[5];
              fVar276 = pfVar44[6];
              pfVar4 = (float *)((long)pvVar369 + lVar377);
              fVar277 = pfVar4[1];
              fVar278 = pfVar4[2];
              fVar279 = pfVar4[3];
              fVar280 = pfVar4[4];
              fVar281 = pfVar4[5];
              fVar282 = pfVar4[6];
              pfVar18 = (float *)((long)pvVar369 + lVar377 + 0x20);
              fVar283 = pfVar18[1];
              fVar284 = pfVar18[2];
              fVar285 = pfVar18[3];
              fVar286 = pfVar18[4];
              fVar287 = pfVar18[5];
              fVar288 = pfVar18[6];
              pfVar19 = (float *)((long)pvVar369 + lVar377 + 0x40);
              fVar289 = pfVar19[1];
              fVar290 = pfVar19[2];
              fVar291 = pfVar19[3];
              fVar292 = pfVar19[4];
              fVar293 = pfVar19[5];
              fVar294 = pfVar19[6];
              pfVar20 = (float *)((long)pvVar369 + lVar377 + 0x60);
              fVar295 = pfVar20[1];
              fVar296 = pfVar20[2];
              fVar297 = pfVar20[3];
              fVar298 = pfVar20[4];
              fVar299 = pfVar20[5];
              fVar300 = pfVar20[6];
              pfVar45 = (float *)((long)pvVar369 + lVar377 + 0x80);
              fVar301 = pfVar45[1];
              fVar302 = pfVar45[2];
              fVar303 = pfVar45[3];
              fVar304 = pfVar45[4];
              fVar305 = pfVar45[5];
              fVar306 = pfVar45[6];
              pfVar46 = (float *)((long)pvVar56 + lVar379 + 0x280);
              fVar307 = pfVar46[1];
              fVar308 = pfVar46[2];
              fVar309 = pfVar46[3];
              fVar310 = pfVar46[4];
              fVar311 = pfVar46[5];
              fVar312 = pfVar46[6];
              fVar313 = pfVar46[7];
              pfVar47 = (float *)((long)pvVar56 + lVar379 + 0x2a0);
              fVar314 = pfVar47[1];
              fVar315 = pfVar47[2];
              fVar316 = pfVar47[3];
              fVar317 = pfVar47[4];
              fVar318 = pfVar47[5];
              fVar319 = pfVar47[6];
              fVar320 = pfVar47[7];
              pfVar48 = (float *)((long)pvVar56 + lVar379 + 0x2c0);
              fVar321 = pfVar48[1];
              fVar322 = pfVar48[2];
              fVar323 = pfVar48[3];
              fVar324 = pfVar48[4];
              fVar325 = pfVar48[5];
              fVar326 = pfVar48[6];
              pfVar49 = (float *)((long)pvVar56 + lVar379 + 0x2e0);
              fVar327 = pfVar49[1];
              fVar328 = pfVar49[2];
              fVar329 = pfVar49[3];
              fVar330 = pfVar49[4];
              fVar331 = pfVar49[5];
              fVar332 = pfVar49[6];
              pfVar50 = (float *)((long)pvVar56 + lVar379 + 0x300);
              fVar333 = pfVar50[1];
              fVar334 = pfVar50[2];
              fVar335 = pfVar50[3];
              fVar336 = pfVar50[4];
              fVar337 = pfVar50[5];
              fVar338 = pfVar50[6];
              pfVar25 = (float *)((long)pvVar372 + lVar377);
              fVar339 = pfVar25[1];
              fVar340 = pfVar25[2];
              fVar341 = pfVar25[3];
              fVar342 = pfVar25[4];
              fVar343 = pfVar25[5];
              fVar344 = pfVar25[6];
              pfVar21 = (float *)((long)pvVar372 + lVar377 + 0x20);
              fVar345 = pfVar21[1];
              fVar346 = pfVar21[2];
              fVar347 = pfVar21[3];
              fVar348 = pfVar21[4];
              fVar349 = pfVar21[5];
              fVar350 = pfVar21[6];
              pfVar22 = (float *)((long)pvVar372 + lVar377 + 0x40);
              fVar351 = pfVar22[1];
              fVar352 = pfVar22[2];
              fVar353 = pfVar22[3];
              fVar354 = pfVar22[4];
              fVar355 = pfVar22[5];
              fVar356 = pfVar22[6];
              pfVar23 = (float *)((long)pvVar372 + lVar377 + 0x60);
              fVar357 = pfVar23[1];
              fVar358 = pfVar23[2];
              fVar359 = pfVar23[3];
              fVar360 = pfVar23[4];
              fVar361 = pfVar23[5];
              fVar362 = pfVar23[6];
              pfVar51 = (float *)((long)pvVar372 + lVar377 + 0x80);
              fVar363 = pfVar51[1];
              fVar364 = pfVar51[2];
              fVar365 = pfVar51[3];
              fVar366 = pfVar51[4];
              fVar367 = pfVar51[5];
              fVar368 = pfVar51[6];
              pfVar5 = (float *)((long)pvVar371 + lVar377);
              *pfVar5 = *pfVar1 * *pfVar2 + fVar380 + *pfVar6 * *pfVar9 + *pfVar7 * *pfVar10 +
                        *pfVar8 * *pfVar11 + *pfVar26 * *pfVar27 + *pfVar28 * *pfVar24 +
                        *pfVar29 * *pfVar12 + *pfVar30 * *pfVar13 + *pfVar31 * *pfVar14 +
                        *pfVar32 * *pfVar33 +
                        *pfVar34 * *pfVar3 + *pfVar35 * *pfVar15 + *pfVar36 * *pfVar16 +
                        *pfVar37 * *pfVar17 + *pfVar38 * *pfVar39 +
                        *pfVar40 * *pfVar4 + *pfVar41 * *pfVar18 + *pfVar42 * *pfVar19 +
                        *pfVar43 * *pfVar20 + *pfVar44 * *pfVar45 + *pfVar46 * *pfVar25 +
                        *pfVar47 * *pfVar21 + *pfVar48 * *pfVar22 + *pfVar49 * *pfVar23 +
                        *pfVar50 * *pfVar51;
              pfVar5[1] = fVar57 * fVar89 + fVar381 + fVar64 * fVar95 + fVar70 * fVar101 +
                          fVar77 * fVar107 + fVar83 * fVar113 + fVar119 * fVar151 +
                          fVar126 * fVar157 + fVar133 * fVar163 + fVar139 * fVar169 +
                          fVar145 * fVar175 +
                          fVar181 * fVar214 + fVar188 * fVar220 + fVar195 * fVar226 +
                          fVar202 * fVar232 + fVar208 * fVar238 +
                          fVar244 * fVar277 + fVar251 * fVar283 + fVar258 * fVar289 +
                          fVar265 * fVar295 + fVar271 * fVar301 + fVar307 * fVar339 +
                          fVar314 * fVar345 + fVar321 * fVar351 + fVar327 * fVar357 +
                          fVar333 * fVar363;
              pfVar5[2] = fVar58 * fVar90 + fVar382 + fVar65 * fVar96 + fVar71 * fVar102 +
                          fVar78 * fVar108 + fVar84 * fVar114 + fVar120 * fVar152 +
                          fVar127 * fVar158 + fVar134 * fVar164 + fVar140 * fVar170 +
                          fVar146 * fVar176 +
                          fVar182 * fVar215 + fVar189 * fVar221 + fVar196 * fVar227 +
                          fVar203 * fVar233 + fVar209 * fVar239 +
                          fVar245 * fVar278 + fVar252 * fVar284 + fVar259 * fVar290 +
                          fVar266 * fVar296 + fVar272 * fVar302 + fVar308 * fVar340 +
                          fVar315 * fVar346 + fVar322 * fVar352 + fVar328 * fVar358 +
                          fVar334 * fVar364;
              pfVar5[3] = fVar59 * fVar91 + fVar383 + fVar66 * fVar97 + fVar72 * fVar103 +
                          fVar79 * fVar109 + fVar85 * fVar115 + fVar121 * fVar153 +
                          fVar128 * fVar159 + fVar135 * fVar165 + fVar141 * fVar171 +
                          fVar147 * fVar177 +
                          fVar183 * fVar216 + fVar190 * fVar222 + fVar197 * fVar228 +
                          fVar204 * fVar234 + fVar210 * fVar240 +
                          fVar246 * fVar279 + fVar253 * fVar285 + fVar260 * fVar291 +
                          fVar267 * fVar297 + fVar273 * fVar303 + fVar309 * fVar341 +
                          fVar316 * fVar347 + fVar323 * fVar353 + fVar329 * fVar359 +
                          fVar335 * fVar365;
              pfVar5[4] = fVar60 * fVar92 + fVar384 + fVar67 * fVar98 + fVar73 * fVar104 +
                          fVar80 * fVar110 + fVar86 * fVar116 + fVar122 * fVar154 +
                          fVar129 * fVar160 + fVar136 * fVar166 + fVar142 * fVar172 +
                          fVar148 * fVar178 +
                          fVar184 * fVar217 + fVar191 * fVar223 + fVar198 * fVar229 +
                          fVar205 * fVar235 + fVar211 * fVar241 +
                          fVar247 * fVar280 + fVar254 * fVar286 + fVar261 * fVar292 +
                          fVar268 * fVar298 + fVar274 * fVar304 + fVar310 * fVar342 +
                          fVar317 * fVar348 + fVar324 * fVar354 + fVar330 * fVar360 +
                          fVar336 * fVar366;
              pfVar5[5] = fVar61 * fVar93 + fVar385 + fVar68 * fVar99 + fVar74 * fVar105 +
                          fVar81 * fVar111 + fVar87 * fVar117 + fVar123 * fVar155 +
                          fVar130 * fVar161 + fVar137 * fVar167 + fVar143 * fVar173 +
                          fVar149 * fVar179 +
                          fVar185 * fVar218 + fVar192 * fVar224 + fVar199 * fVar230 +
                          fVar206 * fVar236 + fVar212 * fVar242 +
                          fVar248 * fVar281 + fVar255 * fVar287 + fVar262 * fVar293 +
                          fVar269 * fVar299 + fVar275 * fVar305 + fVar311 * fVar343 +
                          fVar318 * fVar349 + fVar325 * fVar355 + fVar331 * fVar361 +
                          fVar337 * fVar367;
              pfVar5[6] = fVar62 * fVar94 + fVar386 + fVar69 * fVar100 + fVar75 * fVar106 +
                          fVar82 * fVar112 + fVar88 * fVar118 + fVar124 * fVar156 +
                          fVar131 * fVar162 + fVar138 * fVar168 + fVar144 * fVar174 +
                          fVar150 * fVar180 +
                          fVar186 * fVar219 + fVar193 * fVar225 + fVar200 * fVar231 +
                          fVar207 * fVar237 + fVar213 * fVar243 +
                          fVar249 * fVar282 + fVar256 * fVar288 + fVar263 * fVar294 +
                          fVar270 * fVar300 + fVar276 * fVar306 + fVar312 * fVar344 +
                          fVar319 * fVar350 + fVar326 * fVar356 + fVar332 * fVar362 +
                          fVar338 * fVar368;
              pfVar5[7] = fVar63 + fVar387 + fVar388 + fVar76 + fVar388 + fVar125 +
                          fVar125 + fVar132 + fVar125 + fVar125 +
                          fVar187 + fVar194 + fVar201 + fVar194 + fVar194 +
                          fVar250 + fVar257 + fVar264 + fVar257 + fVar257 + fVar313 +
                          fVar313 + fVar320 + fVar313 + fVar313;
              lVar377 = lVar377 + 0x20;
              iVar374 = iVar374 + -1;
            } while (iVar374 != 0);
            pvVar371 = (void *)((long)pvVar371 + lVar377);
            pvVar376 = (void *)((long)pvVar376 + lVar377);
            pvVar378 = (void *)((long)pvVar378 + lVar377);
            pvVar370 = (void *)((long)pvVar370 + lVar377);
            pvVar369 = (void *)((long)pvVar369 + lVar377);
            pvVar372 = (void *)((long)pvVar372 + lVar377);
          }
          pvVar376 = (void *)((long)pvVar376 + 0x80);
          pvVar378 = (void *)((long)pvVar378 + 0x80);
          pvVar370 = (void *)((long)pvVar370 + 0x80);
          pvVar369 = (void *)((long)pvVar369 + 0x80);
          pvVar372 = (void *)((long)pvVar372 + 0x80);
          iVar375 = iVar375 + 1;
        } while (iVar375 != iVar54);
      }
      lVar373 = lVar373 + 1;
    } while (lVar373 != iVar52);
  }
  return;
}

Assistant:

static void convdw5x5s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);
                __m256 _k03 = _mm256_load_ps(k0 + 24);
                __m256 _k04 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);

                __m256 _k10 = _mm256_load_ps(k0);
                __m256 _k11 = _mm256_load_ps(k0 + 8);
                __m256 _k12 = _mm256_load_ps(k0 + 16);
                __m256 _k13 = _mm256_load_ps(k0 + 24);
                __m256 _k14 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);

                __m256 _k20 = _mm256_load_ps(k0);
                __m256 _k21 = _mm256_load_ps(k0 + 8);
                __m256 _k22 = _mm256_load_ps(k0 + 16);
                __m256 _k23 = _mm256_load_ps(k0 + 24);
                __m256 _k24 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k24, _r24, _sum0);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);
                __m256 _r34 = _mm256_load_ps(r3 + 32);

                __m256 _k30 = _mm256_load_ps(k0);
                __m256 _k31 = _mm256_load_ps(k0 + 8);
                __m256 _k32 = _mm256_load_ps(k0 + 16);
                __m256 _k33 = _mm256_load_ps(k0 + 24);
                __m256 _k34 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k34, _r34, _sum0);

                __m256 _r40 = _mm256_load_ps(r4);
                __m256 _r41 = _mm256_load_ps(r4 + 8);
                __m256 _r42 = _mm256_load_ps(r4 + 16);
                __m256 _r43 = _mm256_load_ps(r4 + 24);
                __m256 _r44 = _mm256_load_ps(r4 + 32);

                __m256 _k40 = _mm256_load_ps(k0);
                __m256 _k41 = _mm256_load_ps(k0 + 8);
                __m256 _k42 = _mm256_load_ps(k0 + 16);
                __m256 _k43 = _mm256_load_ps(k0 + 24);
                __m256 _k44 = _mm256_load_ps(k0 + 32);
                k0 -= 160;

                _sum0 = _mm256_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                r3 += 8;
                r4 += 8;
                outptr0 += 8;
            }

            r0 += 4 * 8;
            r1 += 4 * 8;
            r2 += 4 * 8;
            r3 += 4 * 8;
            r4 += 4 * 8;
        }
    }
}